

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

CandidateVector *
diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_candidates_for_feature
          (CandidateVector *__return_storage_ptr__,Feature ft,Result *r)

{
  ulong uVar1;
  Candidate *__first;
  Candidate *__i;
  Candidate *__last;
  long lVar2;
  
  get_candidates_for_feature(__return_storage_ptr__,ft);
  uVar1 = (__return_storage_ptr__->
          super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
          ).buffer_size;
  if (uVar1 != 0) {
    __first = (__return_storage_ptr__->
              super_VectorView<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
              ).ptr;
    lVar2 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    ::std::
    __introsort_loop<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate*,long,__gnu_cxx::__ops::_Iter_comp_iter<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_candidates_for_feature(diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Result_const&)::__0>>
              (__first,__first + uVar1,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Cross_spirv_glsl_cpp:18961:13)>
                )r);
    if ((long)uVar1 < 0x11) {
      ::std::
      __insertion_sort<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate*,__gnu_cxx::__ops::_Iter_comp_iter<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_candidates_for_feature(diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Result_const&)::__0>>
                (__first,__first + uVar1,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Cross_spirv_glsl_cpp:18961:13)>
                  )r);
    }
    else {
      __last = __first + 0x10;
      ::std::
      __insertion_sort<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate*,__gnu_cxx::__ops::_Iter_comp_iter<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_candidates_for_feature(diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Result_const&)::__0>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Cross_spirv_glsl_cpp:18961:13)>
                  )r);
      lVar2 = uVar1 * 4 + -0x40;
      do {
        ::std::
        __unguarded_linear_insert<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate*,__gnu_cxx::__ops::_Val_comp_iter<diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_candidates_for_feature(diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,diligent_spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Result_const&)::__0>>
                  (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Cross_spirv_glsl_cpp:18961:13)>
                           )r);
        __last = __last + 1;
        lVar2 = lVar2 + -4;
      } while (lVar2 != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::CandidateVector CompilerGLSL::ShaderSubgroupSupportHelper::
    get_candidates_for_feature(Feature ft, const Result &r)
{
	auto c = get_candidates_for_feature(ft);
	auto cmp = [&r](Candidate a, Candidate b) {
		if (r.weights[a] == r.weights[b])
			return a < b; // Prefer candidates with lower enum value
		return r.weights[a] > r.weights[b];
	};
	std::sort(c.begin(), c.end(), cmp);
	return c;
}